

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

string * __thiscall
polyscope::typeName_abi_cxx11_
          (string *__return_storage_ptr__,polyscope *this,ManagedBufferType type)

{
  char *pcVar1;
  char *pcVar2;
  string local_38;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Float";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Double";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Vec2";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Vec3";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Vec4";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Arr2Vec3";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Arr3Vec3";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Arr4Vec3";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "UInt32";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Int32";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "UVec2";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "UVec3";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "UVec4";
    pcVar1 = "";
    break;
  default:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bad enum","");
    exception(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string typeName(ManagedBufferType type) {
  switch (type) {
  // clang-format off
    case ManagedBufferType::Float     : return "Float";    
    case ManagedBufferType::Double    : return "Double";   
    case ManagedBufferType::Vec2      : return "Vec2";     
    case ManagedBufferType::Vec3      : return "Vec3";     
    case ManagedBufferType::Vec4      : return "Vec4";     
    case ManagedBufferType::Arr2Vec3  : return "Arr2Vec3"; 
    case ManagedBufferType::Arr3Vec3  : return "Arr3Vec3"; 
    case ManagedBufferType::Arr4Vec3  : return "Arr4Vec3"; 
    case ManagedBufferType::UInt32    : return "UInt32";   
    case ManagedBufferType::Int32     : return "Int32";    
    case ManagedBufferType::UVec2     : return "UVec2";    
    case ManagedBufferType::UVec3     : return "UVec3";    
    case ManagedBufferType::UVec4     : return "UVec4";
    // clang-format on
  }
  exception("bad enum");
  return 0;
}